

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeDataViewPrototype
               (DynamicObject *dataViewPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  undefined8 in_RAX;
  uint uVar3;
  JavascriptString *pJVar2;
  ulong uVar4;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,dataViewPrototype,mode,2,0);
  this = (((dataViewPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar4 = (ulong)uVar3 << 0x20;
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (dataViewPrototype,0x67,(this->super_JavascriptLibraryBase).dataViewConstructor.ptr,6,0,
             0,uVar4);
  AddFunctionToLibraryObject
            (this,dataViewPrototype,0x1bb,(FunctionInfo *)DataView::EntryInfo::SetInt8,2,'\x06');
  AddFunctionToLibraryObject
            (this,dataViewPrototype,0x1bc,(FunctionInfo *)DataView::EntryInfo::SetUint8,2,'\x06');
  AddFunctionToLibraryObject
            (this,dataViewPrototype,0x1bd,(FunctionInfo *)DataView::EntryInfo::SetInt16,2,'\x06');
  AddFunctionToLibraryObject
            (this,dataViewPrototype,0x1be,(FunctionInfo *)DataView::EntryInfo::SetUint16,2,'\x06');
  AddFunctionToLibraryObject
            (this,dataViewPrototype,0x1bf,(FunctionInfo *)DataView::EntryInfo::SetInt32,2,'\x06');
  AddFunctionToLibraryObject
            (this,dataViewPrototype,0x1c0,(FunctionInfo *)DataView::EntryInfo::SetUint32,2,'\x06');
  AddFunctionToLibraryObject
            (this,dataViewPrototype,0x1c1,(FunctionInfo *)DataView::EntryInfo::SetFloat32,2,'\x06');
  AddFunctionToLibraryObject
            (this,dataViewPrototype,0x1c2,(FunctionInfo *)DataView::EntryInfo::SetFloat64,2,'\x06');
  AddFunctionToLibraryObject
            (this,dataViewPrototype,0x1c3,(FunctionInfo *)DataView::EntryInfo::GetInt8,1,'\x06');
  AddFunctionToLibraryObject
            (this,dataViewPrototype,0x1c4,(FunctionInfo *)DataView::EntryInfo::GetUint8,1,'\x06');
  AddFunctionToLibraryObject
            (this,dataViewPrototype,0x1c5,(FunctionInfo *)DataView::EntryInfo::GetInt16,1,'\x06');
  AddFunctionToLibraryObject
            (this,dataViewPrototype,0x1c6,(FunctionInfo *)DataView::EntryInfo::GetUint16,1,'\x06');
  AddFunctionToLibraryObject
            (this,dataViewPrototype,0x1c7,(FunctionInfo *)DataView::EntryInfo::GetInt32,1,'\x06');
  AddFunctionToLibraryObject
            (this,dataViewPrototype,0x1c8,(FunctionInfo *)DataView::EntryInfo::GetUint32,1,'\x06');
  AddFunctionToLibraryObject
            (this,dataViewPrototype,0x1c9,(FunctionInfo *)DataView::EntryInfo::GetFloat32,1,'\x06');
  AddFunctionToLibraryObject
            (this,dataViewPrototype,0x1ca,(FunctionInfo *)DataView::EntryInfo::GetFloat64,1,'\x06');
  AddAccessorsToLibraryObject
            (this,dataViewPrototype,0x1aa,(FunctionInfo *)DataView::EntryInfo::GetterBuffer,
             (FunctionInfo *)0x0);
  AddAccessorsToLibraryObject
            (this,dataViewPrototype,0x1a9,(FunctionInfo *)DataView::EntryInfo::GetterByteLength,
             (FunctionInfo *)0x0);
  AddAccessorsToLibraryObject
            (this,dataViewPrototype,0x1a8,(FunctionInfo *)DataView::EntryInfo::GetterByteOffset,
             (FunctionInfo *)0x0);
  if (((pSVar1->config).threadConfig)->m_ES6ToStringTag == true) {
    pJVar2 = CreateStringFromCppLiteral<9ul>(this,(char16 (*) [9])0xff9216);
    (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (dataViewPrototype,0x1b,pJVar2,2,0,0,uVar4 & 0xffffffff00000000);
  }
  DynamicObject::SetHasNoEnumerableProperties(dataViewPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeDataViewPrototype(DynamicObject* dataViewPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(dataViewPrototype, mode, 2);

        ScriptContext* scriptContext = dataViewPrototype->GetScriptContext();
        JavascriptLibrary* library = dataViewPrototype->GetLibrary();
        library->AddMember(dataViewPrototype, PropertyIds::constructor, library->dataViewConstructor);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setInt8, &DataView::EntryInfo::SetInt8, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setUint8, &DataView::EntryInfo::SetUint8, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setInt16, &DataView::EntryInfo::SetInt16, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setUint16, &DataView::EntryInfo::SetUint16, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setInt32, &DataView::EntryInfo::SetInt32, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setUint32, &DataView::EntryInfo::SetUint32, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setFloat32, &DataView::EntryInfo::SetFloat32, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setFloat64, &DataView::EntryInfo::SetFloat64, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getInt8, &DataView::EntryInfo::GetInt8, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getUint8, &DataView::EntryInfo::GetUint8, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getInt16, &DataView::EntryInfo::GetInt16, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getUint16, &DataView::EntryInfo::GetUint16, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getInt32, &DataView::EntryInfo::GetInt32, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getUint32, &DataView::EntryInfo::GetUint32, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getFloat32, &DataView::EntryInfo::GetFloat32, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getFloat64, &DataView::EntryInfo::GetFloat64, 1);

        library->AddAccessorsToLibraryObject(dataViewPrototype, PropertyIds::buffer, &DataView::EntryInfo::GetterBuffer, nullptr);
        library->AddAccessorsToLibraryObject(dataViewPrototype, PropertyIds::byteLength, &DataView::EntryInfo::GetterByteLength, nullptr);
        library->AddAccessorsToLibraryObject(dataViewPrototype, PropertyIds::byteOffset, &DataView::EntryInfo::GetterByteOffset, nullptr);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(dataViewPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("DataView")), PropertyConfigurable);
        }

        dataViewPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }